

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

InterpretResult interpret(Vm *vm,char *source)

{
  CallFrame *pCVar1;
  int iVar2;
  InterpretResult IVar3;
  Compiler compiler;
  Compiler local_10c0;
  
  init_compiler(&local_10c0,source);
  memcpy(&vm->compiler,&local_10c0,0x10a8);
  iVar2 = compile(vm);
  IVar3 = INTERPRET_COMPILE_ERROR;
  if (iVar2 == 0) {
    pCVar1 = (vm->frames).frame_pointers[vm->frame_count - 1];
    pCVar1->ip = (pCVar1->code_buffer).code;
    vm->current_status = VM_STATUS_RUNNING;
    IVar3 = run(vm);
    var_ht_free((vm->compiler).scope);
  }
  return IVar3;
}

Assistant:

InterpretResult interpret(Vm *vm, const char *source) {
    Compiler compiler;
    init_compiler(&compiler, source);

    vm->compiler = compiler;
    int compile_result = compile(vm);

    if (compile_result) {
        return INTERPRET_COMPILE_ERROR;
    }

#if DEBUG_SHOW_DISASSEMBLY
    disassemble_curr_frame(vm, "Main Program");
#endif

    CURR_FRAME(vm)->ip = CURR_FRAME(vm)->code_buffer.code;
    vm->current_status = VM_STATUS_RUNNING;
    InterpretResult result = run(vm);
    free_compiler(&vm->compiler);

    return result;
}